

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxDetector.cpp
# Opt level: O2

int dBoxBox2(btVector3 *p1,btScalar *R1,btVector3 *side1,btVector3 *p2,btScalar *R2,btVector3 *side2
            ,btVector3 *normal,btScalar *depth,int *return_code,int maxc,dContactGeom *param_11,
            int param_12,Result *output)

{
  float *pfVar1;
  float *pfVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  btVector3 *pbVar16;
  btScalar *pbVar17;
  ulong uVar18;
  _func_int **pp_Var19;
  uint uVar20;
  btScalar *pbVar21;
  ulong uVar22;
  ulong uVar23;
  int i;
  uint uVar24;
  uint uVar25;
  btScalar *pbVar26;
  btScalar *pbVar27;
  int sign;
  int iVar28;
  ulong uVar29;
  btScalar *pbVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  btScalar bVar34;
  btScalar bVar35;
  btScalar bVar36;
  btScalar bVar37;
  btScalar bVar38;
  btScalar bVar39;
  btScalar bVar40;
  btScalar bVar41;
  btScalar bVar42;
  float fVar43;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  uint extraout_XMM0_Db_02;
  uint extraout_XMM0_Db_03;
  uint extraout_XMM0_Db_04;
  float fVar44;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  btVector3 bVar80;
  btScalar *local_368;
  btScalar *local_358;
  btVector3 *local_340;
  undefined8 local_338;
  float local_328;
  float local_318;
  ulong local_2a8;
  long local_298;
  long local_288;
  ulong local_268;
  undefined8 local_258;
  btScalar rect [2];
  btVector3 posInWorld;
  float local_1e8 [4];
  float local_1d8 [4];
  btVector3 center;
  btScalar dep [8];
  btVector3 nr;
  int iret [8];
  btScalar ret [16];
  btScalar local_118 [4];
  btScalar point [24];
  btVector3 ua;
  btVector3 local_40;
  float *pfVar2;
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar72 [16];
  
  bVar80 = operator-(p2,p1);
  fVar60 = bVar80.m_floats[0];
  fVar67 = bVar80.m_floats[1];
  fVar68 = bVar80.m_floats[2];
  fVar53 = R1[8] * fVar68 + *R1 * fVar60 + R1[4] * fVar67;
  pbVar26 = R1 + 1;
  fVar51 = R1[5];
  fVar55 = R1[1];
  fVar66 = R1[9];
  pbVar30 = R1 + 2;
  fVar78 = R1[6];
  fVar79 = R1[2];
  fVar69 = R1[10];
  fVar45 = (float)*(undefined8 *)side1->m_floats * 0.5;
  fVar48 = (float)((ulong)*(undefined8 *)side1->m_floats >> 0x20) * 0.5;
  fVar46 = side1->m_floats[2] * 0.5;
  fVar47 = (float)*(undefined8 *)side2->m_floats * 0.5;
  fVar49 = (float)((ulong)*(undefined8 *)side2->m_floats >> 0x20) * 0.5;
  fVar50 = side2->m_floats[2] * 0.5;
  local_1e8[0] = fVar47;
  local_1e8[1] = fVar49;
  local_1e8[2] = fVar50;
  local_1d8[0] = fVar45;
  local_1d8[1] = fVar48;
  local_1d8[2] = fVar46;
  bVar34 = dDOT44(R1,R2);
  pbVar17 = R2 + 1;
  bVar35 = dDOT44(R1,pbVar17);
  pbVar27 = R2 + 2;
  bVar36 = dDOT44(R1,pbVar27);
  bVar37 = dDOT44(pbVar26,R2);
  bVar38 = dDOT44(pbVar26,pbVar17);
  bVar39 = dDOT44(pbVar26,pbVar27);
  bVar40 = dDOT44(pbVar30,R2);
  bVar41 = dDOT44(pbVar30,pbVar17);
  bVar42 = dDOT44(pbVar30,pbVar27);
  fVar75 = ABS(bVar34);
  fVar58 = ABS(bVar35);
  fVar54 = ABS(bVar36);
  fVar57 = ABS(fVar53) - (fVar50 * fVar54 + fVar49 * fVar58 + fVar47 * fVar75 + fVar45);
  if (0.0 < fVar57) {
    return 0;
  }
  fVar51 = fVar66 * fVar68 + fVar55 * fVar60 + fVar51 * fVar67;
  fVar76 = ABS(bVar37);
  fVar55 = ABS(bVar38);
  fVar66 = ABS(bVar39);
  bVar11 = fVar57 <= -3.4028235e+38;
  pbVar21 = R1;
  if (bVar11) {
    pbVar21 = (btScalar *)0x0;
    fVar57 = -3.4028235e+38;
  }
  bVar12 = !bVar11 && fVar53 < 0.0;
  uVar25 = (uint)!bVar11;
  fVar77 = ABS(fVar51) - (fVar50 * fVar66 + fVar49 * fVar55 + fVar47 * fVar76 + fVar48);
  if (0.0 < fVar77) {
    return 0;
  }
  fVar56 = ABS(bVar40);
  fVar59 = ABS(bVar41);
  local_318 = ABS(bVar42);
  local_328 = fVar69 * fVar68 + fVar79 * fVar60 + fVar78 * fVar67;
  if (fVar57 < fVar77) {
    bVar12 = fVar51 < 0.0;
    uVar25 = 2;
    pbVar21 = pbVar26;
    fVar57 = fVar77;
  }
  fVar78 = ABS(local_328) - (fVar50 * local_318 + fVar49 * fVar59 + fVar47 * fVar56 + fVar46);
  if (0.0 < fVar78) {
    return 0;
  }
  if (fVar57 < fVar78) {
    bVar12 = local_328 < 0.0;
    uVar25 = 3;
    pbVar21 = pbVar30;
    fVar57 = fVar78;
  }
  fVar79 = R2[8] * fVar68 + *R2 * fVar60 + R2[4] * fVar67;
  fVar78 = ABS(fVar79) - (fVar46 * fVar56 + fVar45 * fVar75 + fVar48 * fVar76 + fVar47);
  if (0.0 < fVar78) {
    return 0;
  }
  if (fVar57 < fVar78) {
    bVar12 = fVar79 < 0.0;
    uVar25 = 4;
    pbVar21 = R2;
    fVar57 = fVar78;
  }
  fVar79 = R2[9] * fVar68 + R2[1] * fVar60 + R2[5] * fVar67;
  fVar78 = ABS(fVar79) - (fVar46 * fVar59 + fVar45 * fVar58 + fVar48 * fVar55 + fVar49);
  if (0.0 < fVar78) {
    return 0;
  }
  if (fVar57 < fVar78) {
    bVar12 = fVar79 < 0.0;
    uVar25 = 5;
    pbVar21 = pbVar17;
    fVar57 = fVar78;
  }
  fVar78 = fVar68 * R2[10] + R2[2] * fVar60 + fVar67 * R2[6];
  fVar79 = ABS(fVar78) - (fVar46 * local_318 + fVar45 * fVar54 + fVar48 * fVar66 + fVar50);
  if (0.0 < fVar79) {
    return 0;
  }
  if (fVar57 < fVar79) {
    bVar12 = fVar78 < 0.0;
    uVar25 = 6;
    pbVar21 = pbVar27;
    fVar57 = fVar79;
  }
  fVar58 = fVar58 + 1e-05;
  fVar54 = fVar54 + 1e-05;
  fVar76 = fVar76 + 1e-05;
  fVar56 = fVar56 + 1e-05;
  fVar79 = local_328 * bVar37 - bVar40 * fVar51;
  fVar78 = ABS(fVar79) - (fVar50 * fVar58 + fVar49 * fVar54 + fVar48 * fVar56 + fVar46 * fVar76);
  if (1.1920929e-07 < fVar78) {
    return 0;
  }
  fVar75 = fVar75 + 1e-05;
  fVar55 = fVar55 + 1e-05;
  fVar59 = fVar59 + 1e-05;
  fVar69 = 0.0;
  fVar60 = bVar40 * bVar40 + 0.0;
  fVar67 = SQRT(bVar37 * bVar37 + fVar60);
  local_338 = 0;
  if ((1.1920929e-07 < fVar67) && (fVar78 = fVar78 / fVar67, fVar57 < fVar78 * 1.05)) {
    auVar62._0_8_ = CONCAT44(extraout_XMM0_Db_02,bVar40) ^ 0x8000000080000000;
    auVar62._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    fVar69 = 0.0 / fVar67;
    auVar62._8_4_ = extraout_XMM0_Db_02 ^ 0x80000000;
    auVar61._8_8_ = auVar62._8_8_;
    auVar61._0_8_ = CONCAT44(bVar37,bVar40) ^ 0x80000000;
    auVar63._0_12_ = auVar61._0_12_;
    auVar63._12_4_ = extraout_XMM0_Db;
    bVar12 = fVar79 < 0.0;
    auVar64._4_4_ = fVar67;
    auVar64._0_4_ = fVar67;
    auVar64._8_4_ = fVar67;
    auVar64._12_4_ = fVar67;
    auVar64 = divps(auVar63,auVar64);
    local_338 = auVar64._0_8_;
    uVar25 = 7;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar78;
  }
  fVar78 = local_328 * bVar38 + bVar41 * -fVar51;
  fVar79 = ABS(fVar78) - (fVar50 * fVar75 + fVar47 * fVar54 + fVar48 * fVar59 + fVar46 * fVar55);
  if (1.1920929e-07 < fVar79) {
    return 0;
  }
  fVar66 = fVar66 + 1e-05;
  local_318 = local_318 + 1e-05;
  fVar67 = bVar41 * bVar41 + 0.0;
  fVar68 = SQRT(bVar38 * bVar38 + fVar67);
  if ((1.1920929e-07 < fVar68) && (fVar79 = fVar79 / fVar68, fVar57 < fVar79 * 1.05)) {
    auVar71._0_8_ = CONCAT44(extraout_XMM0_Db_03,bVar41) ^ 0x8000000080000000;
    auVar71._12_4_ = extraout_XMM0_Dd_00 ^ 0x80000000;
    fVar69 = 0.0 / fVar68;
    auVar71._8_4_ = extraout_XMM0_Db_03 ^ 0x80000000;
    auVar70._8_8_ = auVar71._8_8_;
    auVar70._0_8_ = CONCAT44(bVar38,bVar41) ^ 0x80000000;
    auVar72._0_12_ = auVar70._0_12_;
    auVar72._12_4_ = extraout_XMM0_Db_00;
    bVar12 = fVar78 < 0.0;
    auVar6._4_4_ = fVar68;
    auVar6._0_4_ = fVar68;
    auVar6._8_4_ = fVar68;
    auVar6._12_4_ = fVar68;
    auVar64 = divps(auVar72,auVar6);
    local_338 = auVar64._0_8_;
    uVar25 = 8;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar79;
  }
  fVar79 = local_328 * bVar39 + -fVar51 * bVar42;
  fVar78 = ABS(fVar79) - (fVar49 * fVar75 + fVar47 * fVar58 + fVar48 * local_318 + fVar46 * fVar66);
  if (1.1920929e-07 < fVar78) {
    return 0;
  }
  fVar68 = bVar42 * bVar42 + 0.0;
  fVar77 = SQRT(bVar39 * bVar39 + fVar68);
  if ((1.1920929e-07 < fVar77) && (fVar78 = fVar78 / fVar77, fVar57 < fVar78 * 1.05)) {
    auVar74._0_8_ = CONCAT44(extraout_XMM0_Db_04,bVar42) ^ 0x8000000080000000;
    fVar69 = 0.0 / fVar77;
    auVar74._8_4_ = extraout_XMM0_Db_04 ^ 0x80000000;
    auVar74._12_4_ = extraout_XMM0_Db_01;
    auVar73._8_8_ = auVar74._8_8_;
    auVar73._0_8_ = CONCAT44(bVar39,bVar42) ^ 0x80000000;
    bVar12 = fVar79 < 0.0;
    auVar7._4_4_ = fVar77;
    auVar7._0_4_ = fVar77;
    auVar7._8_4_ = fVar77;
    auVar7._12_4_ = fVar77;
    auVar64 = divps(auVar73,auVar7);
    local_338 = auVar64._0_8_;
    uVar25 = 9;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar78;
  }
  fVar79 = fVar53 * bVar40 - bVar34 * local_328;
  fVar78 = ABS(fVar79) - (fVar50 * fVar55 + fVar49 * fVar66 + fVar45 * fVar56 + fVar46 * fVar75);
  if (1.1920929e-07 < fVar78) {
    return 0;
  }
  local_328 = -local_328;
  fVar60 = SQRT(fVar60 + bVar34 * bVar34);
  if ((1.1920929e-07 < fVar60) && (fVar78 = fVar78 / fVar60, fVar57 < fVar78 * 1.05)) {
    fVar69 = bVar40 / fVar60;
    auVar8._4_4_ = fVar60;
    auVar8._0_4_ = fVar60;
    auVar8._8_4_ = fVar60;
    auVar8._12_4_ = fVar60;
    auVar64 = divps(ZEXT416((uint)-bVar34) << 0x20,auVar8);
    local_338 = auVar64._0_8_;
    bVar12 = fVar79 < 0.0;
    uVar25 = 10;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar78;
  }
  fVar78 = fVar53 * bVar41 + bVar35 * local_328;
  fVar79 = ABS(fVar78) - (fVar50 * fVar76 + fVar47 * fVar66 + fVar45 * fVar59 + fVar46 * fVar58);
  if (1.1920929e-07 < fVar79) {
    return 0;
  }
  auVar65._0_4_ = SQRT(fVar67 + bVar35 * bVar35);
  if ((1.1920929e-07 < auVar65._0_4_) && (fVar79 = fVar79 / auVar65._0_4_, fVar57 < fVar79 * 1.05))
  {
    fVar69 = bVar41 / auVar65._0_4_;
    auVar65._4_4_ = auVar65._0_4_;
    auVar65._8_4_ = auVar65._0_4_;
    auVar65._12_4_ = auVar65._0_4_;
    auVar64 = divps(ZEXT416((uint)-bVar35) << 0x20,auVar65);
    local_338 = auVar64._0_8_;
    bVar12 = fVar78 < 0.0;
    uVar25 = 0xb;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar79;
  }
  fVar78 = fVar53 * bVar42 + local_328 * bVar36;
  fVar79 = ABS(fVar78) - (fVar49 * fVar76 + fVar47 * fVar55 + fVar45 * local_318 + fVar46 * fVar54);
  if (1.1920929e-07 < fVar79) {
    return 0;
  }
  fVar60 = SQRT(fVar68 + bVar36 * bVar36);
  if ((1.1920929e-07 < fVar60) && (fVar79 = fVar79 / fVar60, fVar57 < fVar79 * 1.05)) {
    fVar69 = bVar42 / fVar60;
    auVar9._4_4_ = fVar60;
    auVar9._0_4_ = fVar60;
    auVar9._8_4_ = fVar60;
    auVar9._12_4_ = fVar60;
    auVar64 = divps(ZEXT416((uint)-bVar36) << 0x20,auVar9);
    local_338 = auVar64._0_8_;
    bVar12 = fVar78 < 0.0;
    uVar25 = 0xc;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar79;
  }
  fVar78 = bVar34 * fVar51 - bVar37 * fVar53;
  fVar79 = ABS(fVar78) - (fVar50 * fVar59 + fVar49 * local_318 + fVar76 * fVar45 + fVar75 * fVar48);
  if (1.1920929e-07 < fVar79) {
    return 0;
  }
  fVar60 = SQRT(bVar37 * bVar37 + bVar34 * bVar34);
  if ((1.1920929e-07 < fVar60) && (fVar79 = fVar79 / fVar60, fVar57 < fVar79 * 1.05)) {
    fVar69 = -bVar37 / fVar60;
    bVar12 = fVar78 < 0.0;
    auVar10._4_4_ = fVar60;
    auVar10._0_4_ = fVar60;
    auVar10._8_4_ = fVar60;
    auVar10._12_4_ = fVar60;
    auVar64 = divps(ZEXT416((uint)bVar34),auVar10);
    local_338 = auVar64._0_8_;
    uVar25 = 0xd;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar79;
  }
  fVar78 = bVar35 * fVar51 + bVar38 * -fVar53;
  fVar55 = ABS(fVar78) - (fVar50 * fVar56 + local_318 * fVar47 + fVar55 * fVar45 + fVar58 * fVar48);
  if (1.1920929e-07 < fVar55) {
    return 0;
  }
  fVar79 = SQRT(bVar38 * bVar38 + bVar35 * bVar35);
  if ((1.1920929e-07 < fVar79) && (fVar55 = fVar55 / fVar79, fVar57 < fVar55 * 1.05)) {
    fVar69 = -bVar38 / fVar79;
    bVar12 = fVar78 < 0.0;
    auVar5._4_4_ = fVar79;
    auVar5._0_4_ = fVar79;
    auVar5._8_4_ = fVar79;
    auVar5._12_4_ = fVar79;
    auVar64 = divps(ZEXT416((uint)bVar35),auVar5);
    local_338 = auVar64._0_8_;
    uVar25 = 0xe;
    pbVar21 = (btScalar *)0x0;
    fVar57 = fVar55;
  }
  fVar51 = fVar51 * bVar36 + bVar39 * -fVar53;
  fVar55 = ABS(fVar51) - (fVar49 * fVar56 + fVar47 * fVar59 + fVar45 * fVar66 + fVar48 * fVar54);
  if (1.1920929e-07 < fVar55) {
    return 0;
  }
  auVar52._0_4_ = SQRT(bVar39 * bVar39 + bVar36 * bVar36);
  if ((auVar52._0_4_ <= 1.1920929e-07) || (fVar55 = fVar55 / auVar52._0_4_, fVar55 * 1.05 <= fVar57)
     ) {
    if (uVar25 == 0) {
      return 0;
    }
    if (pbVar21 != (btScalar *)0x0) {
      bVar34 = *pbVar21;
      normal->m_floats[0] = bVar34;
      bVar35 = pbVar21[4];
      normal->m_floats[1] = bVar35;
      bVar36 = pbVar21[8];
      goto LAB_00137d5e;
    }
  }
  else {
    fVar69 = -bVar39 / auVar52._0_4_;
    auVar52._4_4_ = auVar52._0_4_;
    auVar52._8_4_ = auVar52._0_4_;
    auVar52._12_4_ = auVar52._0_4_;
    auVar64 = divps(ZEXT416((uint)bVar36),auVar52);
    local_338 = auVar64._0_8_;
    bVar12 = fVar51 < 0.0;
    uVar25 = 0xf;
    fVar57 = fVar55;
  }
  bVar34 = R1[2] * local_338._4_4_ + *R1 * fVar69 + R1[1] * (float)local_338;
  normal->m_floats[0] = bVar34;
  bVar35 = R1[6] * local_338._4_4_ + R1[4] * fVar69 + R1[5] * (float)local_338;
  normal->m_floats[1] = bVar35;
  bVar36 = local_338._4_4_ * R1[10] + fVar69 * R1[8] + R1[9] * (float)local_338;
LAB_00137d5e:
  normal->m_floats[2] = bVar36;
  if (bVar12) {
    normal->m_floats[0] = -bVar34;
    normal->m_floats[1] = -bVar35;
    normal->m_floats[2] = -bVar36;
  }
  *depth = -fVar57;
  if (uVar25 < 7) {
    fVar51 = normal->m_floats[0];
    if (uVar25 < 4) {
      local_258 = *(ulong *)(normal->m_floats + 1);
      pfVar2 = local_1d8;
      pfVar1 = local_1e8;
      pbVar16 = p2;
      pbVar26 = R1;
      local_358 = R2;
      local_340 = p1;
    }
    else {
      pfVar1 = local_1d8;
      pfVar2 = local_1e8;
      fVar51 = -fVar51;
      local_258 = *(ulong *)(normal->m_floats + 1) ^ 0x8000000080000000;
      pbVar16 = p1;
      pbVar26 = R2;
      local_358 = R1;
      local_340 = p2;
    }
    fVar43 = (float)*(undefined8 *)(local_358 + 8) * local_258._4_4_ +
             fVar51 * (float)*(undefined8 *)local_358 +
             (float)*(undefined8 *)(local_358 + 4) * (float)local_258;
    fVar44 = (float)((ulong)*(undefined8 *)(local_358 + 8) >> 0x20) * local_258._4_4_ +
             fVar51 * (float)((ulong)*(undefined8 *)local_358 >> 0x20) +
             (float)((ulong)*(undefined8 *)(local_358 + 4) >> 0x20) * (float)local_258;
    nr.m_floats[0] = fVar43;
    nr.m_floats[1] = fVar44;
    nr.m_floats[2] =
         local_358[10] * local_258._4_4_ + local_358[2] * fVar51 + local_358[6] * (float)local_258;
    fVar55 = ABS(fVar43);
    fVar66 = ABS(nr.m_floats[2]);
    if (ABS(fVar44) <= fVar55) {
      bVar11 = fVar66 < fVar55;
      local_2a8 = (ulong)bVar11;
      uVar22 = (ulong)((uint)(fVar55 <= fVar66) * 2);
    }
    else {
      bVar11 = fVar66 < ABS(fVar44);
      uVar22 = 2 - (ulong)bVar11;
      local_2a8 = 0;
    }
    local_268 = (ulong)(bVar11 + 1);
    uVar18 = (ulong)(uint)((int)uVar22 * 4);
    pfVar3 = (float *)((long)nr.m_floats + uVar18);
    fVar55 = *(float *)((long)pfVar1 + uVar18);
    if (0.0 < *pfVar3 || *pfVar3 == 0.0) {
      for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 4) {
        *(float *)((long)center.m_floats + lVar14) =
             local_358[uVar22 + lVar14] * -fVar55 +
             (*(float *)((long)pbVar16->m_floats + lVar14) -
             *(float *)((long)local_340->m_floats + lVar14));
      }
    }
    else {
      for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 4) {
        *(float *)((long)center.m_floats + lVar14) =
             local_358[uVar22 + lVar14] * fVar55 +
             (*(float *)((long)pbVar16->m_floats + lVar14) -
             *(float *)((long)local_340->m_floats + lVar14));
      }
    }
    uVar31 = 0;
    iVar28 = 2;
    uVar20 = (-(uint)(uVar25 < 4) | 0xfffffffc) + uVar25;
    if (uVar20 == 0) {
      iVar13 = 1;
    }
    else {
      if (uVar20 != 1) {
        iVar28 = 1;
      }
      iVar13 = 0;
    }
    uVar24 = 4;
    uVar23 = (ulong)(uint)(iVar13 << 2);
    uVar29 = (ulong)(uint)(iVar28 << 2);
    uVar22 = (ulong)(uint)((int)local_2a8 * 4);
    pbVar30 = (btScalar *)((long)local_358 + uVar22);
    fVar55 = *(float *)((long)pbVar26 + uVar29);
    fVar66 = *(float *)((long)pbVar26 + uVar29 + 0x10);
    fVar78 = *(float *)((long)pbVar26 + uVar29 + 0x20);
    fVar79 = *(float *)((long)pbVar26 + uVar23);
    fVar69 = *(float *)((long)pbVar26 + uVar23 + 0x10);
    fVar57 = *(float *)((long)pbVar26 + uVar23 + 0x20);
    bVar34 = dDOT44((btScalar *)((long)pbVar26 + uVar23),pbVar30);
    uVar18 = (ulong)((bVar11 + 1) * 4);
    pbVar17 = (btScalar *)((long)local_358 + uVar18);
    bVar35 = dDOT44((btScalar *)((long)pbVar26 + uVar23),pbVar17);
    bVar36 = dDOT44((btScalar *)((long)pbVar26 + uVar29),pbVar30);
    bVar37 = dDOT44((btScalar *)((long)pbVar26 + uVar29),pbVar17);
    fVar69 = center.m_floats[2] * fVar57 + center.m_floats[0] * fVar79 + center.m_floats[1] * fVar69
    ;
    fVar57 = center.m_floats[2] * fVar78 + center.m_floats[0] * fVar55 + center.m_floats[1] * fVar66
    ;
    fVar55 = *(float *)((long)pfVar1 + uVar22);
    fVar66 = *(float *)((long)pfVar1 + uVar18);
    fVar79 = fVar66 * bVar35;
    fVar66 = fVar66 * bVar37;
    fVar78 = fVar69 - fVar55 * bVar34;
    fVar55 = fVar57 - fVar55 * bVar36;
    pbVar26 = ua.m_floats;
    ua.m_floats[0] = fVar78 - fVar79;
    ua.m_floats[1] = fVar55 - fVar66;
    ua.m_floats[2] = fVar78 + fVar79;
    ua.m_floats[3] = fVar55 + fVar66;
    rect[0] = *(btScalar *)((long)pfVar2 + uVar23);
    rect[1] = *(btScalar *)((long)pfVar2 + uVar29);
    local_368 = ret;
    local_288 = 4;
    pbVar30 = point;
    local_298 = 0;
    for (lVar14 = 0; pbVar17 = pbVar26, lVar14 != 2; lVar14 = lVar14 + 1) {
      uVar22 = (ulong)(uint)((1 - (int)lVar14) * 4);
      for (iVar28 = -1; iVar28 < 2; iVar28 = iVar28 + 2) {
        fVar55 = (float)iVar28;
        lVar32 = 0;
        uVar31 = 0;
        lVar15 = local_288;
        pbVar27 = local_368;
        lVar33 = local_298;
        for (; 0 < (int)uVar24; uVar24 = uVar24 - 1) {
          fVar66 = *(float *)((long)pbVar26 + lVar33);
          fVar79 = fVar66 * fVar55;
          fVar78 = rect[lVar14];
          pbVar17 = local_368;
          if (fVar79 < fVar78) {
            *pbVar27 = *(btScalar *)((long)pbVar26 + lVar32);
            pbVar27[1] = *(btScalar *)((long)pbVar26 + lVar32 + 4);
            uVar31 = uVar31 + 1;
            if ((uVar31 & 8) != 0) goto LAB_001385f9;
            pbVar27 = pbVar27 + 2;
            fVar66 = *(float *)((long)pbVar26 + lVar33);
            fVar78 = rect[lVar14];
            fVar79 = fVar66 * fVar55;
          }
          pbVar21 = (btScalar *)((long)pbVar26 + lVar32 + 8);
          if (uVar24 == 1) {
            pbVar21 = pbVar26;
          }
          if (fVar79 < fVar78 != pbVar21[lVar14] * fVar55 < fVar78) {
            *(float *)((long)pbVar27 + uVar22) =
                 (fVar78 * fVar55 - fVar66) *
                 ((*(float *)((long)pbVar21 + uVar22) - *(float *)((long)pbVar26 + lVar15)) /
                 (pbVar21[lVar14] - fVar66)) + *(float *)((long)pbVar26 + lVar15);
            pbVar27[lVar14] = rect[lVar14] * fVar55;
            uVar31 = uVar31 + 1;
            if ((uVar31 & 8) != 0) goto LAB_001385f9;
            pbVar27 = pbVar27 + 2;
          }
          lVar32 = lVar32 + 8;
          lVar15 = lVar15 + 8;
          lVar33 = lVar33 + 8;
        }
        pbVar17 = ret;
        if (local_368 == ret) {
          pbVar17 = pbVar30;
        }
        pbVar26 = local_368;
        uVar24 = uVar31;
        local_368 = pbVar17;
      }
      local_288 = local_288 + -4;
      local_298 = local_298 + 4;
    }
LAB_001385f9:
    if ((btVector3 *)pbVar17 != (btVector3 *)ret) {
      memcpy(ret,pbVar17,(long)(int)(uVar31 * 2) << 2);
    }
    if (0 < (int)uVar31) {
      fVar66 = 1.0 / (bVar34 * bVar37 - bVar36 * bVar35);
      fVar55 = pfVar2[uVar20];
      local_368 = (btScalar *)0x0;
      for (uVar22 = 0; uVar20 = (uint)local_368, uVar22 != uVar31; uVar22 = uVar22 + 1) {
        uVar4 = *(undefined8 *)(ret + uVar22 * 2);
        fVar78 = (float)uVar4 - fVar69;
        fVar79 = (float)((ulong)uVar4 >> 0x20) - fVar57;
        lVar14 = (long)(int)(uVar20 * 3);
        for (lVar15 = 0; lVar15 != 0xc; lVar15 = lVar15 + 4) {
          *(float *)((long)point + lVar15 + lVar14 * 4) =
               local_358[local_268 + lVar15] *
               (fVar78 * -bVar36 * fVar66 + fVar79 * bVar34 * fVar66) +
               local_358[local_2a8 + lVar15] *
               (bVar37 * fVar66 * fVar78 + -bVar35 * fVar66 * fVar79) +
               *(float *)((long)center.m_floats + lVar15);
        }
        fVar78 = fVar55 - (point[lVar14 + 2] * local_258._4_4_ +
                          point[lVar14] * fVar51 + point[lVar14 + 1] * (float)local_258);
        dep[(int)uVar20] = fVar78;
        if (0.0 <= fVar78) {
          *(undefined8 *)(ret + (int)(uVar20 * 2)) = uVar4;
          local_368 = (btScalar *)(ulong)(uVar20 + 1);
        }
      }
      if (0 < (int)uVar20) {
        if ((int)uVar20 < maxc) {
          maxc = uVar20;
        }
        uVar22 = 1;
        if (1 < maxc) {
          uVar22 = (ulong)(uint)maxc;
        }
        if ((uint)uVar22 < uVar20) {
          uVar23 = 0;
          for (uVar18 = 1; local_368 != (btScalar *)uVar18; uVar18 = uVar18 + 1) {
            if (dep[0] < dep[uVar18]) {
              uVar23 = uVar18 & 0xffffffff;
              dep[0] = dep[uVar18];
            }
          }
          cullPoints2(uVar20,ret,(uint)uVar22,(int)uVar23,iret);
          for (uVar18 = 0; local_368 = (btScalar *)uVar22, uVar18 != uVar22; uVar18 = uVar18 + 1) {
            iVar28 = iret[uVar18];
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              posInWorld.m_floats[lVar14] = point[iVar28 * 3 + lVar14] + local_340->m_floats[lVar14]
              ;
            }
            if (uVar25 < 4) {
              local_118 = (btScalar  [4])operator-(normal);
              pp_Var19 = output->_vptr_Result;
              pbVar16 = &posInWorld;
            }
            else {
              local_118 = (btScalar  [4])operator-(normal);
              bVar80 = operator*(normal,dep + iVar28);
              local_40.m_floats[0] = posInWorld.m_floats[0] - bVar80.m_floats[0];
              local_40.m_floats[1] = posInWorld.m_floats[1] - bVar80.m_floats[1];
              local_40.m_floats[2] = posInWorld.m_floats[2] - bVar80.m_floats[2];
              local_40.m_floats[3] = 0.0;
              pp_Var19 = output->_vptr_Result;
              pbVar16 = &local_40;
            }
            (*pp_Var19[4])(output,local_118,pbVar16);
          }
        }
        else if (uVar25 < 4) {
          pbVar26 = point;
          for (uVar22 = 0; (btScalar *)uVar22 != local_368; uVar22 = uVar22 + 1) {
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              iret[lVar14] = (int)(pbVar26[lVar14] + local_340->m_floats[lVar14]);
            }
            posInWorld = operator-(normal);
            (*output->_vptr_Result[4])(output,&posInWorld,iret);
            pbVar26 = pbVar26 + 3;
          }
        }
        else {
          for (uVar22 = 0; (btScalar *)uVar22 != local_368; uVar22 = uVar22 + 1) {
            fVar51 = dep[uVar22];
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              iret[lVar14] = (int)((pbVar30[lVar14] + local_340->m_floats[lVar14]) -
                                  normal->m_floats[lVar14] * fVar51);
            }
            posInWorld = operator-(normal);
            (*output->_vptr_Result[4])(output,&posInWorld,iret);
            pbVar30 = pbVar30 + 3;
          }
        }
        *return_code = uVar25;
        return (int)local_368;
      }
    }
    local_368._0_4_ = 0;
  }
  else {
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      point[lVar14] = p1->m_floats[lVar14];
    }
    pbVar26 = R1;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      bVar34 = dDOT14(normal->m_floats,R1 + lVar14);
      fVar51 = local_1d8[lVar14];
      for (lVar15 = 0; lVar15 != 0xc; lVar15 = lVar15 + 4) {
        *(float *)((long)point + lVar15) =
             pbVar26[lVar15] *
             (float)(~-(uint)(0.0 < bVar34) & (uint)-fVar51 | -(uint)(0.0 < bVar34) & (uint)fVar51)
             + *(float *)((long)point + lVar15);
      }
      pbVar26 = pbVar26 + 1;
    }
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      ret[lVar14] = p2->m_floats[lVar14];
    }
    pbVar26 = R2;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      bVar34 = dDOT14(normal->m_floats,R2 + lVar14);
      fVar51 = local_1e8[lVar14];
      for (lVar15 = 0; lVar15 != 0xc; lVar15 = lVar15 + 4) {
        *(float *)((long)ret + lVar15) =
             pbVar26[lVar15] *
             (float)(~-(uint)(0.0 < bVar34) & (uint)fVar51 | (uint)-fVar51 & -(uint)(0.0 < bVar34))
             + *(float *)((long)ret + lVar15);
      }
      pbVar26 = pbVar26 + 1;
    }
    for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 4) {
      *(btScalar *)((long)ua.m_floats + lVar14) = R1[(ulong)(uVar25 - 7) / 3 + lVar14];
    }
    for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 4) {
      *(btScalar *)((long)dep + lVar14) = R2[(ulong)(uVar25 - 7) % 3 + lVar14];
    }
    dLineClosestApproach
              ((btVector3 *)point,&ua,(btVector3 *)ret,(btVector3 *)dep,nr.m_floats,center.m_floats)
    ;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      point[lVar14] = ua.m_floats[lVar14] * nr.m_floats[0] + point[lVar14];
    }
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      ret[lVar14] = dep[lVar14] * center.m_floats[0] + ret[lVar14];
    }
    iret._0_16_ = (undefined1  [16])operator-(normal);
    (*output->_vptr_Result[4])(output,iret,ret);
    *return_code = uVar25;
    local_368._0_4_ = 1;
  }
  return (int)local_368;
}

Assistant:

int dBoxBox2 (const btVector3& p1, const dMatrix3 R1,
	     const btVector3& side1, const btVector3& p2,
	     const dMatrix3 R2, const btVector3& side2,
	     btVector3& normal, btScalar *depth, int *return_code,
		 int maxc, dContactGeom * /*contact*/, int /*skip*/,btDiscreteCollisionDetectorInterface::Result& output)
{
  const btScalar fudge_factor = btScalar(1.05);
  btVector3 p,pp,normalC(0.f,0.f,0.f);
  const btScalar *normalR = 0;
  btScalar A[3],B[3],R11,R12,R13,R21,R22,R23,R31,R32,R33,
    Q11,Q12,Q13,Q21,Q22,Q23,Q31,Q32,Q33,s,s2,l;
  int i,j,invert_normal,code;

  // get vector from centers of box 1 to box 2, relative to box 1
  p = p2 - p1;
  dMULTIPLY1_331 (pp,R1,p);		// get pp = p relative to body 1

  // get side lengths / 2
  A[0] = side1[0]*btScalar(0.5);
  A[1] = side1[1]*btScalar(0.5);
  A[2] = side1[2]*btScalar(0.5);
  B[0] = side2[0]*btScalar(0.5);
  B[1] = side2[1]*btScalar(0.5);
  B[2] = side2[2]*btScalar(0.5);

  // Rij is R1'*R2, i.e. the relative rotation between R1 and R2
  R11 = dDOT44(R1+0,R2+0); R12 = dDOT44(R1+0,R2+1); R13 = dDOT44(R1+0,R2+2);
  R21 = dDOT44(R1+1,R2+0); R22 = dDOT44(R1+1,R2+1); R23 = dDOT44(R1+1,R2+2);
  R31 = dDOT44(R1+2,R2+0); R32 = dDOT44(R1+2,R2+1); R33 = dDOT44(R1+2,R2+2);

  Q11 = btFabs(R11); Q12 = btFabs(R12); Q13 = btFabs(R13);
  Q21 = btFabs(R21); Q22 = btFabs(R22); Q23 = btFabs(R23);
  Q31 = btFabs(R31); Q32 = btFabs(R32); Q33 = btFabs(R33);

  // for all 15 possible separating axes:
  //   * see if the axis separates the boxes. if so, return 0.
  //   * find the depth of the penetration along the separating axis (s2)
  //   * if this is the largest depth so far, record it.
  // the normal vector will be set to the separating axis with the smallest
  // depth. note: normalR is set to point to a column of R1 or R2 if that is
  // the smallest depth normal so far. otherwise normalR is 0 and normalC is
  // set to a vector relative to body 1. invert_normal is 1 if the sign of
  // the normal should be flipped.

#define TST(expr1,expr2,norm,cc) \
  s2 = btFabs(expr1) - (expr2); \
  if (s2 > 0) return 0; \
  if (s2 > s) { \
    s = s2; \
    normalR = norm; \
    invert_normal = ((expr1) < 0); \
    code = (cc); \
  }

  s = -dInfinity;
  invert_normal = 0;
  code = 0;

  // separating axis = u1,u2,u3
  TST (pp[0],(A[0] + B[0]*Q11 + B[1]*Q12 + B[2]*Q13),R1+0,1);
  TST (pp[1],(A[1] + B[0]*Q21 + B[1]*Q22 + B[2]*Q23),R1+1,2);
  TST (pp[2],(A[2] + B[0]*Q31 + B[1]*Q32 + B[2]*Q33),R1+2,3);

  // separating axis = v1,v2,v3
  TST (dDOT41(R2+0,p),(A[0]*Q11 + A[1]*Q21 + A[2]*Q31 + B[0]),R2+0,4);
  TST (dDOT41(R2+1,p),(A[0]*Q12 + A[1]*Q22 + A[2]*Q32 + B[1]),R2+1,5);
  TST (dDOT41(R2+2,p),(A[0]*Q13 + A[1]*Q23 + A[2]*Q33 + B[2]),R2+2,6);

  // note: cross product axes need to be scaled when s is computed.
  // normal (n1,n2,n3) is relative to box 1.
#undef TST
#define TST(expr1,expr2,n1,n2,n3,cc) \
  s2 = btFabs(expr1) - (expr2); \
  if (s2 > SIMD_EPSILON) return 0; \
  l = btSqrt((n1)*(n1) + (n2)*(n2) + (n3)*(n3)); \
  if (l > SIMD_EPSILON) { \
    s2 /= l; \
    if (s2*fudge_factor > s) { \
      s = s2; \
      normalR = 0; \
      normalC[0] = (n1)/l; normalC[1] = (n2)/l; normalC[2] = (n3)/l; \
      invert_normal = ((expr1) < 0); \
      code = (cc); \
    } \
  }

  btScalar fudge2 (1.0e-5f);

  Q11 += fudge2;
  Q12 += fudge2;
  Q13 += fudge2;

  Q21 += fudge2;
  Q22 += fudge2;
  Q23 += fudge2;

  Q31 += fudge2;
  Q32 += fudge2;
  Q33 += fudge2;

  // separating axis = u1 x (v1,v2,v3)
  TST(pp[2]*R21-pp[1]*R31,(A[1]*Q31+A[2]*Q21+B[1]*Q13+B[2]*Q12),0,-R31,R21,7);
  TST(pp[2]*R22-pp[1]*R32,(A[1]*Q32+A[2]*Q22+B[0]*Q13+B[2]*Q11),0,-R32,R22,8);
  TST(pp[2]*R23-pp[1]*R33,(A[1]*Q33+A[2]*Q23+B[0]*Q12+B[1]*Q11),0,-R33,R23,9);

  // separating axis = u2 x (v1,v2,v3)
  TST(pp[0]*R31-pp[2]*R11,(A[0]*Q31+A[2]*Q11+B[1]*Q23+B[2]*Q22),R31,0,-R11,10);
  TST(pp[0]*R32-pp[2]*R12,(A[0]*Q32+A[2]*Q12+B[0]*Q23+B[2]*Q21),R32,0,-R12,11);
  TST(pp[0]*R33-pp[2]*R13,(A[0]*Q33+A[2]*Q13+B[0]*Q22+B[1]*Q21),R33,0,-R13,12);

  // separating axis = u3 x (v1,v2,v3)
  TST(pp[1]*R11-pp[0]*R21,(A[0]*Q21+A[1]*Q11+B[1]*Q33+B[2]*Q32),-R21,R11,0,13);
  TST(pp[1]*R12-pp[0]*R22,(A[0]*Q22+A[1]*Q12+B[0]*Q33+B[2]*Q31),-R22,R12,0,14);
  TST(pp[1]*R13-pp[0]*R23,(A[0]*Q23+A[1]*Q13+B[0]*Q32+B[1]*Q31),-R23,R13,0,15);

#undef TST

  if (!code) return 0;

  // if we get to this point, the boxes interpenetrate. compute the normal
  // in global coordinates.
  if (normalR) {
    normal[0] = normalR[0];
    normal[1] = normalR[4];
    normal[2] = normalR[8];
  }
  else {
    dMULTIPLY0_331 (normal,R1,normalC);
  }
  if (invert_normal) {
    normal[0] = -normal[0];
    normal[1] = -normal[1];
    normal[2] = -normal[2];
  }
  *depth = -s;

  // compute contact point(s)

  if (code > 6) {
    // an edge from box 1 touches an edge from box 2.
    // find a point pa on the intersecting edge of box 1
    btVector3 pa;
    btScalar sign;
    for (i=0; i<3; i++) pa[i] = p1[i];
    for (j=0; j<3; j++) {
      sign = (dDOT14(normal,R1+j) > 0) ? btScalar(1.0) : btScalar(-1.0);
      for (i=0; i<3; i++) pa[i] += sign * A[j] * R1[i*4+j];
    }

    // find a point pb on the intersecting edge of box 2
    btVector3 pb;
    for (i=0; i<3; i++) pb[i] = p2[i];
    for (j=0; j<3; j++) {
      sign = (dDOT14(normal,R2+j) > 0) ? btScalar(-1.0) : btScalar(1.0);
      for (i=0; i<3; i++) pb[i] += sign * B[j] * R2[i*4+j];
    }

    btScalar alpha,beta;
    btVector3 ua,ub;
    for (i=0; i<3; i++) ua[i] = R1[((code)-7)/3 + i*4];
    for (i=0; i<3; i++) ub[i] = R2[((code)-7)%3 + i*4];

    dLineClosestApproach (pa,ua,pb,ub,&alpha,&beta);
    for (i=0; i<3; i++) pa[i] += ua[i]*alpha;
    for (i=0; i<3; i++) pb[i] += ub[i]*beta;

	{
		
		//contact[0].pos[i] = btScalar(0.5)*(pa[i]+pb[i]);
		//contact[0].depth = *depth;
		btVector3 pointInWorld;

#ifdef USE_CENTER_POINT
	    for (i=0; i<3; i++) 
			pointInWorld[i] = (pa[i]+pb[i])*btScalar(0.5);
		output.addContactPoint(-normal,pointInWorld,-*depth);
#else
		output.addContactPoint(-normal,pb,-*depth);

#endif //
		*return_code = code;
	}
    return 1;
  }

  // okay, we have a face-something intersection (because the separating
  // axis is perpendicular to a face). define face 'a' to be the reference
  // face (i.e. the normal vector is perpendicular to this) and face 'b' to be
  // the incident face (the closest face of the other box).

  const btScalar *Ra,*Rb,*pa,*pb,*Sa,*Sb;
  if (code <= 3) {
    Ra = R1;
    Rb = R2;
    pa = p1;
    pb = p2;
    Sa = A;
    Sb = B;
  }
  else {
    Ra = R2;
    Rb = R1;
    pa = p2;
    pb = p1;
    Sa = B;
    Sb = A;
  }

  // nr = normal vector of reference face dotted with axes of incident box.
  // anr = absolute values of nr.
  btVector3 normal2,nr,anr;
  if (code <= 3) {
    normal2[0] = normal[0];
    normal2[1] = normal[1];
    normal2[2] = normal[2];
  }
  else {
    normal2[0] = -normal[0];
    normal2[1] = -normal[1];
    normal2[2] = -normal[2];
  }
  dMULTIPLY1_331 (nr,Rb,normal2);
  anr[0] = btFabs (nr[0]);
  anr[1] = btFabs (nr[1]);
  anr[2] = btFabs (nr[2]);

  // find the largest compontent of anr: this corresponds to the normal
  // for the indident face. the other axis numbers of the indicent face
  // are stored in a1,a2.
  int lanr,a1,a2;
  if (anr[1] > anr[0]) {
    if (anr[1] > anr[2]) {
      a1 = 0;
      lanr = 1;
      a2 = 2;
    }
    else {
      a1 = 0;
      a2 = 1;
      lanr = 2;
    }
  }
  else {
    if (anr[0] > anr[2]) {
      lanr = 0;
      a1 = 1;
      a2 = 2;
    }
    else {
      a1 = 0;
      a2 = 1;
      lanr = 2;
    }
  }

  // compute center point of incident face, in reference-face coordinates
  btVector3 center;
  if (nr[lanr] < 0) {
    for (i=0; i<3; i++) center[i] = pb[i] - pa[i] + Sb[lanr] * Rb[i*4+lanr];
  }
  else {
    for (i=0; i<3; i++) center[i] = pb[i] - pa[i] - Sb[lanr] * Rb[i*4+lanr];
  }

  // find the normal and non-normal axis numbers of the reference box
  int codeN,code1,code2;
  if (code <= 3) codeN = code-1; else codeN = code-4;
  if (codeN==0) {
    code1 = 1;
    code2 = 2;
  }
  else if (codeN==1) {
    code1 = 0;
    code2 = 2;
  }
  else {
    code1 = 0;
    code2 = 1;
  }

  // find the four corners of the incident face, in reference-face coordinates
  btScalar quad[8];	// 2D coordinate of incident face (x,y pairs)
  btScalar c1,c2,m11,m12,m21,m22;
  c1 = dDOT14 (center,Ra+code1);
  c2 = dDOT14 (center,Ra+code2);
  // optimize this? - we have already computed this data above, but it is not
  // stored in an easy-to-index format. for now it's quicker just to recompute
  // the four dot products.
  m11 = dDOT44 (Ra+code1,Rb+a1);
  m12 = dDOT44 (Ra+code1,Rb+a2);
  m21 = dDOT44 (Ra+code2,Rb+a1);
  m22 = dDOT44 (Ra+code2,Rb+a2);
  {
    btScalar k1 = m11*Sb[a1];
    btScalar k2 = m21*Sb[a1];
    btScalar k3 = m12*Sb[a2];
    btScalar k4 = m22*Sb[a2];
    quad[0] = c1 - k1 - k3;
    quad[1] = c2 - k2 - k4;
    quad[2] = c1 - k1 + k3;
    quad[3] = c2 - k2 + k4;
    quad[4] = c1 + k1 + k3;
    quad[5] = c2 + k2 + k4;
    quad[6] = c1 + k1 - k3;
    quad[7] = c2 + k2 - k4;
  }

  // find the size of the reference face
  btScalar rect[2];
  rect[0] = Sa[code1];
  rect[1] = Sa[code2];

  // intersect the incident and reference faces
  btScalar ret[16];
  int n = intersectRectQuad2 (rect,quad,ret);
  if (n < 1) return 0;		// this should never happen

  // convert the intersection points into reference-face coordinates,
  // and compute the contact position and depth for each point. only keep
  // those points that have a positive (penetrating) depth. delete points in
  // the 'ret' array as necessary so that 'point' and 'ret' correspond.
  btScalar point[3*8];		// penetrating contact points
  btScalar dep[8];			// depths for those points
  btScalar det1 = 1.f/(m11*m22 - m12*m21);
  m11 *= det1;
  m12 *= det1;
  m21 *= det1;
  m22 *= det1;
  int cnum = 0;			// number of penetrating contact points found
  for (j=0; j < n; j++) {
    btScalar k1 =  m22*(ret[j*2]-c1) - m12*(ret[j*2+1]-c2);
    btScalar k2 = -m21*(ret[j*2]-c1) + m11*(ret[j*2+1]-c2);
    for (i=0; i<3; i++) point[cnum*3+i] =
			  center[i] + k1*Rb[i*4+a1] + k2*Rb[i*4+a2];
    dep[cnum] = Sa[codeN] - dDOT(normal2,point+cnum*3);
    if (dep[cnum] >= 0) {
      ret[cnum*2] = ret[j*2];
      ret[cnum*2+1] = ret[j*2+1];
      cnum++;
    }
  }
  if (cnum < 1) return 0;	// this should never happen

  // we can't generate more contacts than we actually have
  if (maxc > cnum) maxc = cnum;
  if (maxc < 1) maxc = 1;

  if (cnum <= maxc) {

	  if (code<4) 
	  {
    // we have less contacts than we need, so we use them all
    for (j=0; j < cnum; j++) 
	{
		btVector3 pointInWorld;
		for (i=0; i<3; i++) 
			pointInWorld[i] = point[j*3+i] + pa[i];
		output.addContactPoint(-normal,pointInWorld,-dep[j]);

    }
	  } else
	  {
		  // we have less contacts than we need, so we use them all
		for (j=0; j < cnum; j++) 
		{
			btVector3 pointInWorld;
			for (i=0; i<3; i++) 
				pointInWorld[i] = point[j*3+i] + pa[i]-normal[i]*dep[j];
				//pointInWorld[i] = point[j*3+i] + pa[i];
			output.addContactPoint(-normal,pointInWorld,-dep[j]);
		}
	  }
  }
  else {
    // we have more contacts than are wanted, some of them must be culled.
    // find the deepest point, it is always the first contact.
    int i1 = 0;
    btScalar maxdepth = dep[0];
    for (i=1; i<cnum; i++) {
      if (dep[i] > maxdepth) {
	maxdepth = dep[i];
	i1 = i;
      }
    }

    int iret[8];
    cullPoints2 (cnum,ret,maxc,i1,iret);

    for (j=0; j < maxc; j++) {
//      dContactGeom *con = CONTACT(contact,skip*j);
  //    for (i=0; i<3; i++) con->pos[i] = point[iret[j]*3+i] + pa[i];
    //  con->depth = dep[iret[j]];

		btVector3 posInWorld;
		for (i=0; i<3; i++) 
			posInWorld[i] = point[iret[j]*3+i] + pa[i];
		if (code<4) 
	   {
			output.addContactPoint(-normal,posInWorld,-dep[iret[j]]);
		} else
		{
			output.addContactPoint(-normal,posInWorld-normal*dep[iret[j]],-dep[iret[j]]);
		}
    }
    cnum = maxc;
  }

  *return_code = code;
  return cnum;
}